

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfNamedBufferSubData(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  byte bVar10;
  GLuint not_a_buffer_name;
  GLuint GVar11;
  GLuint buffer;
  GLubyte dummy_data [4];
  GLuint immutable_storage_buffer;
  GLuint local_44 [2];
  byte local_39;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  GLuint local_34;
  long lVar9;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar7);
  local_44[0] = 0;
  local_34 = 0;
  local_44[1] = 0;
  (**(code **)(lVar9 + 0x3b8))(1);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1339);
  (*this->m_pNamedBufferStorage)(local_44[0],4,local_44 + 1,0x143);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x133d);
  (**(code **)(lVar9 + 0x3b8))(1,&local_34);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1340);
  (*this->m_pNamedBufferStorage)(local_34,4,local_44 + 1,1);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1343);
  GVar11 = 0;
  do {
    GVar11 = GVar11 + 1;
    cVar1 = (**(code **)(lVar9 + 0xc68))(GVar11);
  } while (cVar1 != '\0');
  (*this->m_pNamedBufferSubData)(GVar11,0,4,local_44 + 1);
  bVar2 = ErrorCheckAndLog(this,"glNamedBufferSubData",0x502,
                           " if buffer is not the name of an existing buffer object.");
  (*this->m_pNamedBufferSubData)(local_44[0],-1,4,local_44 + 1);
  local_35 = ErrorCheckAndLog(this,"glNamedBufferSubData",0x501," if offset or size is negative.");
  (*this->m_pNamedBufferSubData)(local_44[0],0,-1,local_44 + 1);
  local_36 = ErrorCheckAndLog(this,"glNamedBufferSubData",0x501," if offset or size is negative.");
  (*this->m_pNamedBufferSubData)(local_44[0],0,8,local_44 + 1);
  local_37 = ErrorCheckAndLog(this,"glNamedBufferSubData",0x501,
                              " if offset+size is greater than the value of BUFFER_SIZE for the specified buffer object."
                             );
  (*this->m_pNamedBufferSubData)(local_44[0],2,4,local_44 + 1);
  local_38 = ErrorCheckAndLog(this,"glNamedBufferSubData",0x501,
                              " if offset+size is greater than the value of BUFFER_SIZE for the specified buffer object."
                             );
  (*this->m_pMapNamedBuffer)(local_44[0],35000);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x137b);
  (*this->m_pNamedBufferSubData)(local_44[0],0,4,local_44 + 1);
  local_39 = ErrorCheckAndLog(this,"glNamedBufferSubData",0x502,
                              " if any part of the specified range of the buffer object is mapped with MapBuffer, unless it was mapped with the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags."
                             );
  (*this->m_pUnmapNamedBuffer)(local_44[0]);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1385);
  (*this->m_pMapNamedBufferRange)(local_44[0],0,4,1);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x138b);
  (*this->m_pNamedBufferSubData)(local_44[0],0,4,local_44 + 1);
  bVar3 = ErrorCheckAndLog(this,"glNamedBufferSubData",0x502,
                           " if any part of the specified range of the buffer object is mapped with MapBufferRange, unless it was mapped with the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags."
                          );
  (*this->m_pUnmapNamedBuffer)(local_44[0]);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1395);
  (*this->m_pMapNamedBufferRange)(local_44[0],0,4,0x41);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glMapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x139c);
  (*this->m_pNamedBufferSubData)(local_44[0],0,4,local_44 + 1);
  bVar4 = ErrorCheckAndLog(this,"glNamedBufferSubData",0,
                           " if any part of the specified range of the buffer object is mapped with MapBuffer with the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags."
                          );
  (*this->m_pUnmapNamedBuffer)(local_44[0]);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x13a6);
  (*this->m_pNamedBufferSubData)(local_34,0,4,local_44 + 1);
  bVar5 = ErrorCheckAndLog(this,"glNamedBufferSubData",0x502,
                           " if the value of the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE and the value of BUFFER_STORAGE_FLAGS for the buffer object does not have the DYNAMIC_STORAGE_BIT bit set."
                          );
  (*this->m_pNamedBufferSubData)(local_44[0],0,4,local_44 + 1);
  bVar6 = ErrorCheckAndLog(this,"glNamedBufferSubData",0,
                           " if the value of the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE and the value of BUFFER_STORAGE_FLAGS for the buffer object have the DYNAMIC_STORAGE_BIT bit set."
                          );
  bVar10 = bVar2 & local_35 & local_36 & local_37 & local_38 & local_39;
  if (local_44[0] != 0) {
    (**(code **)(lVar9 + 0x438))(1,local_44);
    local_44[0] = 0;
  }
  if (local_34 != 0) {
    (**(code **)(lVar9 + 0x438))(1,&local_34);
  }
  return (bool)(bVar10 & bVar3 & bVar4 & bVar5 & bVar6);
}

Assistant:

bool ErrorsTest::TestErrorsOfNamedBufferSubData()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer					  = 0;
	glw::GLuint  immutable_storage_buffer = 0;
	glw::GLubyte dummy_data[4]			  = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_DYNAMIC_STORAGE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		gl.createBuffers(1, &immutable_storage_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(immutable_storage_buffer, sizeof(dummy_data), &dummy_data, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pNamedBufferSubData(not_a_buffer_name, 0, sizeof(dummy_data), &dummy_data);

			is_ok &= ErrorCheckAndLog("glNamedBufferSubData", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test negative offset error behavior. */
		{
			/* Test. */
			m_pNamedBufferSubData(buffer, -1, sizeof(dummy_data), &dummy_data);

			is_ok &= ErrorCheckAndLog("glNamedBufferSubData", GL_INVALID_VALUE, " if offset or size is negative.");
		}

		/* Test negative size error behavior. */
		{
			/* Test. */
			m_pNamedBufferSubData(buffer, 0, -1, &dummy_data);

			is_ok &= ErrorCheckAndLog("glNamedBufferSubData", GL_INVALID_VALUE, " if offset or size is negative.");
		}

		/* Test size overflow error behavior. */
		{
			/* Test. */
			m_pNamedBufferSubData(buffer, 0, sizeof(dummy_data) * 2, &dummy_data);

			is_ok &= ErrorCheckAndLog(
				"glNamedBufferSubData", GL_INVALID_VALUE,
				" if offset+size is greater than the value of BUFFER_SIZE for the specified buffer object.");
		}

		/* Test offset+size overflow error behavior. */
		{
			/* Test. */
			m_pNamedBufferSubData(buffer, sizeof(dummy_data) / 2, sizeof(dummy_data), &dummy_data);

			is_ok &= ErrorCheckAndLog(
				"glNamedBufferSubData", GL_INVALID_VALUE,
				" if offset+size is greater than the value of BUFFER_SIZE for the specified buffer object.");
		}

		/* Test of mapped buffer subdata error behavior verification (with glMapBuffer). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBuffer(buffer, GL_READ_ONLY);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pNamedBufferSubData(buffer, 0, sizeof(dummy_data), &dummy_data);

			is_ok &= ErrorCheckAndLog("glNamedBufferSubData", GL_INVALID_OPERATION,
									  " if any part of the specified range of the buffer"
									  " object is mapped with MapBuffer, unless it was mapped with "
									  "the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of mapped buffer subdata error behavior verification (with glMapBufferRange). */
		{
			(void)(glw::GLbyte*) m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pNamedBufferSubData(buffer, 0, sizeof(dummy_data), &dummy_data);

			is_ok &= ErrorCheckAndLog("glNamedBufferSubData", GL_INVALID_OPERATION,
									  " if any part of the specified range of the buffer"
									  " object is mapped with MapBufferRange, unless it was mapped with "
									  "the MAP_PERSISTENT_BIT bit set in the MapBufferRange access flags.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test of persistently mapped buffer clear error with behavior verification. */
		{
			(void)(glw::GLbyte*)
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer failed.");

			m_pNamedBufferSubData(buffer, 0, sizeof(dummy_data), &dummy_data);

			is_ok &= ErrorCheckAndLog("glNamedBufferSubData", GL_NO_ERROR,
									  " if any part of the specified range of the buffer"
									  " object is mapped with MapBuffer with the MAP_PERSISTENT_BIT"
									  " bit set in the MapBufferRange access flags.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");
		}

		/* Test DYNAMIC_STORAGE_BIT bit off immutable buffer not set error behavior. */
		{
			/* Test. */
			m_pNamedBufferSubData(immutable_storage_buffer, 0, sizeof(dummy_data), &dummy_data);

			is_ok &= ErrorCheckAndLog("glNamedBufferSubData", GL_INVALID_OPERATION,
									  " if the value of the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE"
									  " and the value of BUFFER_STORAGE_FLAGS for the buffer object does not"
									  " have the DYNAMIC_STORAGE_BIT bit set.");
		}

		/* Test DYNAMIC_STORAGE_BIT bit off immutable buffer set no error behavior. */
		{
			/* Test. */
			m_pNamedBufferSubData(buffer, 0, sizeof(dummy_data), &dummy_data);

			is_ok &= ErrorCheckAndLog("glNamedBufferSubData", GL_NO_ERROR,
									  " if the value of the BUFFER_IMMUTABLE_STORAGE flag of the buffer object is TRUE"
									  " and the value of BUFFER_STORAGE_FLAGS for the buffer object"
									  " have the DYNAMIC_STORAGE_BIT bit set.");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (immutable_storage_buffer)
	{
		gl.deleteBuffers(1, &immutable_storage_buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}